

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprNodeSize(Expr *p,int flags)

{
  size_t sVar1;
  int in_ESI;
  Expr *in_RDI;
  int nByte;
  uint local_10;
  
  local_10 = dupedExprStructSize(in_RDI,in_ESI);
  local_10 = local_10 & 0xfff;
  if (((in_RDI->flags & 0x400) == 0) && ((in_RDI->u).zToken != (char *)0x0)) {
    sVar1 = strlen((in_RDI->u).zToken);
    local_10 = local_10 + ((uint)sVar1 & 0x3fffffff) + 1;
  }
  return local_10 + 7 & 0xfffffff8;
}

Assistant:

static int dupedExprNodeSize(Expr *p, int flags){
  int nByte = dupedExprStructSize(p, flags) & 0xfff;
  if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
    nByte += sqlite3Strlen30NN(p->u.zToken)+1;
  }
  return ROUND8(nByte);
}